

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
LDPC4QKD::read_rate_adaption_from_csv<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          string *file_path)

{
  iterator iVar1;
  char cVar2;
  istream *piVar3;
  runtime_error *this;
  ulong uVar4;
  undefined8 uVar5;
  string current_line;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec_of_two;
  ifstream fs;
  string local_278;
  string *local_258;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_250;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_258 = file_path;
  std::ifstream::ifstream((istream *)local_238,(string *)file_path,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Stream object invalid.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = 0;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
LAB_00122746:
  cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238);
  piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)local_238,(string *)&local_278,cVar2);
  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                               local_278.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_238);
    return __return_storage_ptr__;
  }
  HelpersReadFilesLDPC::helper_parse_sep_ints<unsigned_int>(&local_250,&local_278,',');
  if (local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
LAB_0012285b:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,
               uVar4);
  }
  iVar1._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar1,
               local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  else {
    *iVar1._M_current =
         *local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  uVar4 = (long)local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (uVar4 < 2) {
    uVar5 = 1;
    goto LAB_0012285b;
  }
  iVar1._M_current =
       (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001227f0;
  *iVar1._M_current =
       local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  goto LAB_00122802;
LAB_001227f0:
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar1,
             local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1);
  if (local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
LAB_00122802:
    operator_delete(local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  goto LAB_00122746;
}

Assistant:

std::vector<rowidx> read_rate_adaption_from_csv(const std::string &file_path) {
        try {
            std::ifstream fs(file_path);
            if (!fs) {
                throw std::runtime_error("Stream object invalid.");
            }

            std::string current_line;

            std::vector<rowidx> rows_to_combine{};

            while(getline(fs, current_line)) {
                const auto vec_of_two = HelpersReadFilesLDPC::helper_parse_sep_ints<rowidx>(current_line, ',');
                rows_to_combine.push_back(vec_of_two.at(0));
                rows_to_combine.push_back(vec_of_two.at(1));
            }

            return rows_to_combine;
        }
        catch (const std::exception &e) {
            std::stringstream s;
            s << "Failed to read rate adaption from file '" << file_path << "'. Reason:\n" << e.what() << "\n";
            throw std::runtime_error(s.str());
        }
        catch (...) {
            std::stringstream s;
            s << "Failed to read read rate adaption from file '" << file_path << "' due to unknown error.";
            throw std::runtime_error(s.str());
        }
    }